

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O0

void __thiscall minibag::Recorder::startWriting(Recorder *this)

{
  Level LVar1;
  void *pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  CompressionType CVar5;
  long in_RDI;
  undefined1 uVar6;
  String msg;
  bool enabled_1;
  bool enabled;
  BagException e;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_98 [32];
  undefined6 in_stack_ffffffffffffff88;
  allocator<char> in_stack_ffffffffffffff8f;
  Publisher *in_stack_ffffffffffffff90;
  
  CVar5 = (CompressionType)(string *)(in_RDI + 0x140);
  minibag::Bag::setCompression(CVar5);
  minibag::Bag::setChunkThreshold(CVar5);
  updateFilenames((Recorder *)e.super_Exception._0_8_);
  minibag::Bag::open((string *)(in_RDI + 0x140),(int)in_RDI + 0x3e0);
  if ((((byte)miniros::console::g_initialized ^ 0xff) & 1) != 0) {
    miniros::console::initialize();
  }
  if (((startWriting()::loc.initialized_ ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    miniros::console::initializeLogLocation
              (&startWriting()::loc,(string *)&stack0xffffffffffffff90,Info);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  }
  if (startWriting()::loc.level_ != Info) {
    miniros::console::setLogLocationLevel(&startWriting()::loc,Info);
    miniros::console::checkLogLocationEnabled(&startWriting()::loc);
  }
  pvVar2 = startWriting()::loc.logger_;
  LVar1 = startWriting()::loc.level_;
  uVar6 = (startWriting()::loc.logger_enabled_ & 1U) != 0;
  if ((bool)uVar6) {
    uVar3 = std::__cxx11::string::c_str();
    miniros::console::print
              ((FilterBase *)0x0,pvVar2,LVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
               ,0x166,"void minibag::Recorder::startWriting()","Recording to %s.",uVar3);
  }
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    std_msgs::String_<std::allocator<void>_>::String_((String_<std::allocator<void>_> *)0x1d6517);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_98,pcVar4);
    miniros::Publisher::publish<std_msgs::String_<std::allocator<void>>>
              (in_stack_ffffffffffffff90,
               (String_<std::allocator<void>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(uVar6,in_stack_ffffffffffffff88)));
    std_msgs::String_<std::allocator<void>_>::~String_((String_<std::allocator<void>_> *)0x1d6559);
  }
  return;
}

Assistant:

void Recorder::startWriting()
{
  bag_.setCompression(options_.compression);
  bag_.setChunkThreshold(options_.chunk_size);

  updateFilenames();
  try {
    bag_.open(write_filename_, bagmode::Write);
  } catch (minibag::BagException e) {
    MINIROS_ERROR("Error writing: %s", e.what());
    exit_code_ = 1;
    miniros::shutdown();
  }
  MINIROS_INFO("Recording to %s.", target_filename_.c_str());

  if (options_.publish) {
    std_msgs::String msg;
    msg.data = target_filename_.c_str();
    pub_begin_write.publish(msg);
  }
}